

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  uint uVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar5;
  LogMessage local_1b0;
  char *pcVar4;
  
  pcVar3 = rewrite->data_;
  pcVar5 = pcVar3 + rewrite->size_;
  do {
    if (pcVar5 <= pcVar3) {
LAB_001ca1eb:
      return pcVar5 <= pcVar3;
    }
    if (*pcVar3 != '\\') {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(out,*pcVar3);
      pcVar4 = pcVar3;
      goto LAB_001ca12d;
    }
    pcVar4 = pcVar3 + 1;
    if (pcVar5 <= pcVar4) {
LAB_001ca132:
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/re2.cc"
                   ,0x423);
        poVar2 = std::operator<<(&local_1b0.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                                 "invalid rewrite pattern: ");
        std::operator<<(poVar2,rewrite->data_);
LAB_001ca1e1:
        LogMessage::~LogMessage(&local_1b0);
      }
      goto LAB_001ca1eb;
    }
    uVar1 = (int)*pcVar4 - 0x30;
    if (uVar1 < 10) {
      if (veclen <= (int)uVar1) {
        if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/re2.cc"
                     ,0x417);
          poVar2 = std::operator<<(&local_1b0.str_.
                                    super_basic_ostream<char,_std::char_traits<char>_>,
                                   "invalid substitution \\");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
          poVar2 = std::operator<<(poVar2," from ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,veclen);
          std::operator<<(poVar2," groups");
          goto LAB_001ca1e1;
        }
        goto LAB_001ca1eb;
      }
      if (vec[uVar1].size_ != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (out,vec[uVar1].data_,vec[uVar1].size_);
      }
    }
    else {
      if (*pcVar4 != '\\') goto LAB_001ca132;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(out,'\\');
    }
LAB_001ca12d:
    pcVar3 = pcVar4 + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(std::string* out,
                  const StringPiece& rewrite,
                  const StringPiece* vec,
                  int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "invalid substitution \\" << n
                     << " from " << veclen << " groups";
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (!snip.empty())
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}